

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O3

spv_result_t spvtools::val::MemoryPass(ValidationState_t *_,Instruction *inst)

{
  CapabilitySet *pCVar1;
  pointer puVar2;
  ushort uVar3;
  short sVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  pointer puVar7;
  undefined4 id;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  AddressingModel AVar14;
  uint uVar15;
  StorageClass SVar16;
  int32_t iVar17;
  uint32_t uVar18;
  spv_result_t sVar19;
  Function *pFVar20;
  long *plVar21;
  Instruction *pIVar22;
  Instruction *pIVar23;
  undefined8 *puVar24;
  DiagnosticStream *pDVar25;
  Instruction *pIVar26;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte bVar27;
  size_type *psVar28;
  ulong uVar29;
  byte bVar30;
  long lVar31;
  byte bVar32;
  char *pcVar33;
  size_t index;
  _Any_data *p_Var34;
  byte bVar35;
  Op opcode;
  ulong uVar36;
  undefined8 uVar37;
  byte bVar38;
  string instr_name;
  anon_class_24_3_e757d3e0 ValidateType;
  uint64_t stride_value;
  uint32_t data_type;
  string errorVUID;
  undefined1 local_298 [34];
  byte local_276;
  byte local_275;
  byte local_274;
  byte local_273;
  byte local_272;
  char local_271;
  _Any_data local_270;
  undefined1 local_260 [24];
  Function *local_248;
  char *local_240;
  _Any_data local_238;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [28];
  spv_result_t local_48;
  size_type local_40;
  __node_base local_38;
  
  uVar3 = (inst->inst_).opcode;
  if (0x1141 < uVar3) {
    if (uVar3 < 0x1169) {
      switch(uVar3) {
      case 0x1142:
        goto switchD_001d9ff1_caseD_3b;
      case 0x1143:
      case 0x1144:
        goto switchD_001d9ff1_caseD_41;
      case 0x1147:
      case 0x1148:
        goto switchD_001d9ff1_caseD_43;
      case 0x1149:
        goto switchD_001d9ff1_caseD_44;
      }
      goto switchD_001d9ff1_caseD_3c;
    }
    opcode = (Op)uVar3;
    if (OpTypeCooperativeMatrixNV < opcode) {
      if (uVar3 - 0x14ef < 2) {
        if (opcode == OpCooperativeMatrixLoadNV) {
          local_270._M_unused._M_object = "spv::Op::OpCooperativeMatrixLoadNV";
          pIVar22 = inst;
        }
        else {
          uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,1);
          pIVar22 = ValidationState_t::FindDef(_,uVar15);
          local_270._M_unused._M_object = "spv::Op::OpCooperativeMatrixStoreNV";
        }
        uVar18 = (pIVar22->inst_).type_id;
        pIVar22 = ValidationState_t::FindDef(_,uVar18);
        uVar5 = (inst->inst_).opcode;
        if ((pIVar22->inst_).opcode != 0x14ee) {
          if (uVar5 != 0x14ef) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            pcVar33 = "spv::Op::OpCooperativeMatrixStoreNV Object type <id> ";
            goto LAB_001dae71;
          }
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          pcVar33 = "spv::Op::OpCooperativeMatrixLoadNV Result Type <id> ";
          lVar31 = 0x34;
          goto LAB_001dae76;
        }
        uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((uint)(uVar5 == 0x14ef) * 2));
        pIVar22 = ValidationState_t::FindDef(_,uVar15);
        if (pIVar22 == (Instruction *)0x0) {
LAB_001db3ec:
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          p_Var34 = &local_270;
          goto LAB_001db40c;
        }
        AVar14 = ValidationState_t::addressing_model(_);
        if (AVar14 == AddressingModelLogical) {
          bVar9 = (_->features_).variable_pointers;
          if ((bool)bVar9 == false) {
            iVar17 = spvOpcodeReturnsLogicalPointer((uint)(pIVar22->inst_).opcode);
            if (iVar17 == 0) goto LAB_001db3ec;
            bVar9 = (_->features_).variable_pointers;
          }
          if (((bVar9 & 1) != 0) &&
             (bVar10 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar22->inst_).opcode),
             !bVar10)) goto LAB_001db3ec;
        }
        uVar18 = (pIVar22->inst_).type_id;
        pIVar23 = ValidationState_t::FindDef(_,uVar18);
        if ((pIVar23 == (Instruction *)0x0) || ((pIVar23->inst_).opcode != 0x20)) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          p_Var34 = &local_270;
          goto LAB_001db232;
        }
        SVar16 = Instruction::GetOperandAs<spv::StorageClass>(pIVar23,1);
        if (((SVar16 == StorageClassWorkgroup) || (SVar16 == StorageBuffer)) ||
           (SVar16 == PhysicalStorageBuffer)) {
          uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
          pIVar23 = ValidationState_t::FindDef(_,uVar15);
          if ((pIVar23 != (Instruction *)0x0) &&
             ((bVar10 = ValidationState_t::IsIntScalarOrVectorType(_,uVar15), bVar10 ||
              (bVar10 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar15), bVar10)))) {
            uVar15 = Instruction::GetOperandAs<unsigned_int>
                               (inst,(ulong)((inst->inst_).opcode == 0x14ef) | 2);
            pIVar22 = ValidationState_t::FindDef(_,uVar15);
            if ((pIVar22 != (Instruction *)0x0) &&
               (bVar10 = ValidationState_t::IsIntScalarType(_,(pIVar22->inst_).type_id), bVar10)) {
              uVar15 = Instruction::GetOperandAs<unsigned_int>
                                 (inst,(ulong)((inst->inst_).opcode == 0x14ef) + 3);
              pIVar22 = ValidationState_t::FindDef(_,uVar15);
              if (((pIVar22 == (Instruction *)0x0) ||
                  (bVar10 = ValidationState_t::IsBoolScalarType(_,(pIVar22->inst_).type_id), !bVar10
                  )) || ((iVar17 = spvOpcodeIsConstant((uint)(pIVar22->inst_).opcode), iVar17 == 0
                         && (iVar17 = spvOpcodeIsSpecConstant((uint)(pIVar22->inst_).opcode),
                            iVar17 == 0)))) {
                ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"Column Major operand <id> ",0x1a);
                ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
                pcVar33 = " must be a boolean constant instruction.";
                lVar31 = 0x28;
                goto LAB_001db58b;
              }
              uVar15 = (inst->inst_).opcode == 0x14ef | 4;
              if ((ulong)uVar15 <
                  (ulong)((long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4)) {
                sVar19 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar15);
                goto joined_r0x001db5c3;
              }
              goto switchD_001d9ff1_caseD_3c;
            }
LAB_001dbf67:
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,"Stride operand <id> ",0x14);
            goto LAB_001dc496;
          }
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          p_Var34 = &local_270;
LAB_001dc19e:
          pDVar25 = DiagnosticStream::operator<<((DiagnosticStream *)local_218,(char **)p_Var34);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar25," Pointer <id> ",0xe);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,(pIVar22->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar25,(char *)local_298._0_8_,local_298._8_8_);
          pcVar33 = "s Type must be a scalar or vector type.";
          lVar31 = 0x27;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          pDVar25 = DiagnosticStream::operator<<((DiagnosticStream *)local_218,(char **)&local_270);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar25," storage class for pointer type <id> ",0x25);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar25,(char *)local_298._0_8_,local_298._8_8_);
          pcVar33 = " is not Workgroup or StorageBuffer.";
          lVar31 = 0x23;
        }
LAB_001db456:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar25,pcVar33,lVar31);
        sVar19 = pDVar25->error_;
        goto LAB_001db5a2;
      }
      if (opcode == OpCooperativeMatrixLengthNV) goto LAB_001da490;
      if (opcode != OpRawAccessChainNV) goto switchD_001d9ff1_caseD_3c;
      local_238._M_unused._M_object = inst;
      pcVar33 = spvOpcodeString(OpRawAccessChainNV);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_218,pcVar33,(allocator<char> *)local_270._M_pod_data);
      plVar21 = (long *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x3c1057);
      psVar28 = (size_type *)(plVar21 + 2);
      if ((size_type *)*plVar21 == psVar28) {
        local_298._16_8_ = *psVar28;
        local_298._24_8_ = plVar21[3];
        local_298._0_8_ = local_298 + 0x10;
      }
      else {
        local_298._16_8_ = *psVar28;
        local_298._0_8_ = (size_type *)*plVar21;
      }
      local_298._8_8_ = plVar21[1];
      *plVar21 = (long)psVar28;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_218._4_4_,local_218._0_4_) != local_208) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_218._4_4_,local_218._0_4_),
                        local_208[0]._M_allocated_capacity + 1);
      }
      pIVar22 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
      if ((pIVar22->inst_).opcode == 0x20) {
        SVar16 = Instruction::GetOperandAs<spv::StorageClass>(pIVar22,1);
        if (((SVar16 != StorageClassUniform) && (SVar16 != StorageBuffer)) &&
           (SVar16 != PhysicalStorageBuffer)) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"The Result Type of ",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_270._M_unused._0_8_,local_270._8_8_);
          pcVar33 = 
          " must point to a storage class of StorageBuffer, PhysicalStorageBuffer, or Uniform.";
          lVar31 = 0x53;
LAB_001db7c8:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar33,lVar31);
          goto LAB_001db7d7;
        }
        uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar22,2);
        pIVar22 = ValidationState_t::FindDef(_,uVar15);
        uVar15 = (uint)(pIVar22->inst_).opcode;
        if ((uVar15 < 0x1f) && ((0x51000000U >> (uVar15 & 0x1f) & 1) != 0)) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"The Result Type of ",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_270._M_unused._0_8_,local_270._8_8_);
          pcVar33 = " must not point to OpTypeArray, OpTypeMatrix, or OpTypeStruct.";
          lVar31 = 0x3e;
          goto LAB_001db7c8;
        }
        uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,3);
        pIVar22 = ValidationState_t::FindDef(_,uVar15);
        if ((pIVar22->inst_).opcode != 0x2b) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"The Stride of ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_270._M_unused._0_8_,local_270._8_8_);
          pcVar33 = " must be OpConstant. Found Op";
          lVar31 = 0x1d;
          goto LAB_001db14b;
        }
        pIVar23 = ValidationState_t::FindDef(_,(pIVar22->inst_).type_id);
        if ((pIVar23->inst_).opcode != 0x15) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"The type of Stride of ",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_270._M_unused._0_8_,local_270._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218," must be OpTypeInt. Found Op",0x1c);
          uVar3 = (pIVar23->inst_).opcode;
          goto LAB_001db159;
        }
        local_270._8_8_ = &local_238;
        local_270._M_unused._M_object = _;
        local_260._0_8_ = (spv_const_context)local_298;
        sVar19 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                           ((anon_class_24_3_e757d3e0 *)&local_270,"Index",4);
        if ((sVar19 == SPV_SUCCESS) &&
           (sVar19 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                               ((anon_class_24_3_e757d3e0 *)&local_270,"Offset",5),
           sVar19 == SPV_SUCCESS)) {
          sVar19 = SPV_SUCCESS;
          if (*(long *)(local_238._M_unused._M_function_pointer + 0x20) -
              *(size_t *)(local_238._M_unused._M_function_pointer + 0x18) < 0x61) goto LAB_001db7fe;
          uVar15 = Instruction::GetOperandAs<unsigned_int>
                             ((Instruction *)local_238._M_unused._0_8_,6);
          if ((uVar15 & 2) == 0) {
LAB_001dcd5c:
            if ((uVar15 & 1) == 0) {
              if ((SVar16 == PhysicalStorageBuffer & (byte)((uVar15 & 2) >> 1)) != 0) {
LAB_001dce92:
                ValidationState_t::diag
                          ((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,
                           (Instruction *)local_238._M_unused._0_8_);
                pcVar33 = 
                "Storage class cannot be PhysicalStorageBuffer when raw access chain robustness is used."
                ;
                lVar31 = 0x57;
                goto LAB_001dcebb;
              }
            }
            else {
              if (SVar16 == PhysicalStorageBuffer) goto LAB_001dce92;
              sVar19 = SPV_SUCCESS;
              if ((uVar15 & 2) != 0) {
                ValidationState_t::diag
                          ((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,
                           (Instruction *)local_238._M_unused._0_8_);
                pcVar33 = 
                "Per-component robustness and per-element robustness are mutually exclusive.";
                lVar31 = 0x4b;
                goto LAB_001dcebb;
              }
            }
            goto LAB_001db7fe;
          }
          local_240 = (char *)0x0;
          bVar10 = ValidationState_t::EvalConstantValUint64
                             (_,(pIVar22->inst_).result_id,(uint64_t *)&local_240);
          if ((!bVar10) || (local_240 != (char *)0x0)) goto LAB_001dcd5c;
          ValidationState_t::diag
                    ((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,
                     (Instruction *)local_238._M_unused._0_8_);
          pcVar33 = "Stride must not be zero when per-element robustness is used.";
          lVar31 = 0x3c;
LAB_001dcebb:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar33,lVar31);
          goto LAB_001db7f9;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"The Result Type of ",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_270._M_unused._0_8_,local_270._8_8_);
        pcVar33 = " must be OpTypePointer. Found Op";
        lVar31 = 0x20;
LAB_001db14b:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar33,lVar31);
        uVar3 = (pIVar22->inst_).opcode;
LAB_001db159:
        local_240 = spvOpcodeString((uint)uVar3);
        pDVar25 = DiagnosticStream::operator<<((DiagnosticStream *)local_218,&local_240);
        local_271 = '.';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar25,&local_271,1);
        local_48 = pDVar25->error_;
LAB_001db7d7:
        if ((ValidationState_t *)local_270._M_unused._0_8_ != (ValidationState_t *)local_260) {
          operator_delete(local_270._M_unused._M_object,
                          (ulong)((long)(spv_target_env *)local_260._0_8_ + 1));
        }
LAB_001db7f9:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
        sVar19 = local_48;
      }
LAB_001db7fe:
      if ((undefined1 *)local_298._0_8_ == local_298 + 0x10) goto joined_r0x001db5c3;
      goto LAB_001dad39;
    }
    if (1 < uVar3 - 0x1169) {
      if (opcode != OpCooperativeMatrixLengthKHR) goto switchD_001d9ff1_caseD_3c;
LAB_001da490:
      pcVar33 = spvOpcodeString(opcode);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_218,pcVar33,(allocator<char> *)local_270._M_pod_data);
      puVar24 = (undefined8 *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x3c1057)
      ;
      local_298._0_8_ = local_298 + 0x10;
      psVar28 = puVar24 + 2;
      if ((size_type *)*puVar24 == psVar28) {
        local_298._16_8_ = *psVar28;
        local_298._24_8_ = puVar24[3];
      }
      else {
        local_298._16_8_ = *psVar28;
        local_298._0_8_ = (size_type *)*puVar24;
      }
      local_298._8_8_ = puVar24[1];
      *puVar24 = psVar28;
      puVar24[1] = 0;
      *(undefined1 *)(puVar24 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_218._4_4_,local_218._0_4_) != local_208) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_218._4_4_,local_218._0_4_),
                        local_208[0]._M_allocated_capacity + 1);
      }
      pIVar22 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
      if ((((pIVar22->inst_).opcode != 0x15) ||
          (uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar22,1), uVar15 != 0x20)) ||
         (uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar22,2), uVar15 != 0))
      goto LAB_001dac73;
      uVar5 = (inst->inst_).opcode;
      uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar22 = ValidationState_t::FindDef(_,uVar15);
      uVar6 = (pIVar22->inst_).opcode;
      if (uVar5 == 0x116c) {
        if (uVar6 == 0x1168) {
LAB_001dbc92:
          sVar19 = SPV_SUCCESS;
          goto LAB_001dad2c;
        }
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"The type in ",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_270._M_unused._0_8_,local_270._8_8_);
        pcVar33 = " must be OpTypeCooperativeMatrixKHR.";
        lVar31 = 0x24;
      }
      else {
        if (uVar6 == 0x14ee) goto LAB_001dbc92;
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"The type in ",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_270._M_unused._0_8_,local_270._8_8_);
        pcVar33 = " must be OpTypeCooperativeMatrixNV.";
        lVar31 = 0x23;
      }
      goto LAB_001dacf6;
    }
    if (opcode == OpCooperativeMatrixLoadKHR) {
      local_238._M_unused._M_object = "spv::Op::OpCooperativeMatrixLoadKHR";
      pIVar22 = inst;
    }
    else {
      uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      pIVar22 = ValidationState_t::FindDef(_,uVar15);
      local_238._M_unused._M_object = "spv::Op::OpCooperativeMatrixStoreKHR";
    }
    uVar18 = (pIVar22->inst_).type_id;
    pIVar22 = ValidationState_t::FindDef(_,uVar18);
    uVar5 = (inst->inst_).opcode;
    if ((pIVar22->inst_).opcode != 0x1168) {
      if (uVar5 == 0x1169) {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        pcVar33 = "spv::Op::OpCooperativeMatrixLoadKHR Result Type <id> ";
LAB_001dae71:
        lVar31 = 0x35;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        pcVar33 = "spv::Op::OpCooperativeMatrixStoreKHR Object type <id> ";
        lVar31 = 0x36;
      }
LAB_001dae76:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar33,lVar31);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
      pcVar33 = " is not a cooperative matrix type.";
      lVar31 = 0x22;
      goto LAB_001db58b;
    }
    uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)((uint)(uVar5 == 0x1169) * 2));
    pIVar22 = ValidationState_t::FindDef(_,uVar15);
    if (pIVar22 == (Instruction *)0x0) {
LAB_001db392:
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      p_Var34 = &local_238;
LAB_001db40c:
      pDVar25 = DiagnosticStream::operator<<((DiagnosticStream *)local_218,(char **)p_Var34);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar25," Pointer <id> ",0xe);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar25,(char *)local_298._0_8_,local_298._8_8_);
      pcVar33 = " is not a logical pointer.";
      lVar31 = 0x1a;
      goto LAB_001db456;
    }
    AVar14 = ValidationState_t::addressing_model(_);
    if (AVar14 == AddressingModelLogical) {
      bVar9 = (_->features_).variable_pointers;
      if ((bool)bVar9 == false) {
        iVar17 = spvOpcodeReturnsLogicalPointer((uint)(pIVar22->inst_).opcode);
        if (iVar17 == 0) goto LAB_001db392;
        bVar9 = (_->features_).variable_pointers;
      }
      if (((bVar9 & 1) != 0) &&
         (bVar10 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar22->inst_).opcode), !bVar10))
      goto LAB_001db392;
    }
    uVar18 = (pIVar22->inst_).type_id;
    local_248 = (Function *)CONCAT44(local_248._4_4_,uVar18);
    pIVar23 = ValidationState_t::FindDef(_,uVar18);
    if ((pIVar23 == (Instruction *)0x0) ||
       ((uVar5 = (pIVar23->inst_).opcode, uVar5 != 0x20 && (uVar5 != 0x1141)))) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      p_Var34 = &local_238;
LAB_001db232:
      pDVar25 = DiagnosticStream::operator<<((DiagnosticStream *)local_218,(char **)p_Var34);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar25," type for pointer <id> ",0x17);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar25,(char *)local_298._0_8_,local_298._8_8_);
      pcVar33 = " is not a pointer type.";
      lVar31 = 0x17;
      goto LAB_001db456;
    }
    SVar16 = Instruction::GetOperandAs<spv::StorageClass>(pIVar23,1);
    if (((SVar16 == StorageClassWorkgroup) || (SVar16 == StorageBuffer)) ||
       (SVar16 == PhysicalStorageBuffer)) {
      if (uVar5 != 0x1141) {
        uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
        pIVar23 = ValidationState_t::FindDef(_,uVar15);
        if ((pIVar23 == (Instruction *)0x0) ||
           ((bVar10 = ValidationState_t::IsIntScalarOrVectorType(_,uVar15), !bVar10 &&
            (bVar10 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar15), !bVar10)))) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          p_Var34 = &local_238;
          goto LAB_001dc19e;
        }
      }
      uVar15 = Instruction::GetOperandAs<unsigned_int>
                         (inst,(ulong)((inst->inst_).opcode == 0x1169) | 2);
      pIVar22 = ValidationState_t::FindDef(_,uVar15);
      if (((pIVar22 == (Instruction *)0x0) ||
          (bVar10 = ValidationState_t::IsIntScalarType(_,(pIVar22->inst_).type_id), !bVar10)) ||
         (iVar17 = spvOpcodeIsConstant((uint)(pIVar22->inst_).opcode), iVar17 == 0)) {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"MemoryLayout operand <id> ",0x1a);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
        pcVar33 = " must be a 32-bit integer constant instruction.";
        lVar31 = 0x2f;
        goto LAB_001db58b;
      }
      bVar10 = ValidationState_t::EvalConstantValUint64(_,uVar15,(uint64_t *)local_270._M_pod_data);
      uVar5 = (inst->inst_).opcode;
      index = (ulong)(uVar5 == 0x1169) + 3;
      uVar36 = (long)(inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (index < uVar36) {
        uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,index);
        pIVar22 = ValidationState_t::FindDef(_,uVar15);
        if ((pIVar22 == (Instruction *)0x0) ||
           (bVar10 = ValidationState_t::IsIntScalarType(_,(pIVar22->inst_).type_id), !bVar10))
        goto LAB_001dbf67;
        uVar5 = (inst->inst_).opcode;
        uVar36 = (long)(inst->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(inst->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4;
      }
      else if (bVar10 && local_270._M_unused._M_object < (ValidationState_t *)0x2) {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"MemoryLayout ",0xd)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)local_218);
        pcVar33 = " requires a Stride.";
        lVar31 = 0x13;
        goto LAB_001db494;
      }
      uVar15 = uVar5 == 0x1169 | 4;
      if ((uVar36 <= uVar15) ||
         (sVar19 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar15), sVar19 == SPV_SUCCESS)) {
        sVar19 = SPV_SUCCESS;
      }
      goto joined_r0x001db5c3;
    }
    ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
    ValidationState_t::VkErrorID_abi_cxx11_((string *)local_298,_,0x230d,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
    pDVar25 = DiagnosticStream::operator<<((DiagnosticStream *)local_218,(char **)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar25," storage class for pointer type <id> ",0x25);
    ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(uint32_t)local_248);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar25,(char *)local_270._M_unused._0_8_,local_270._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar25," is not Workgroup, StorageBuffer, or PhysicalStorageBuffer.",0x3b
              );
    local_48 = pDVar25->error_;
LAB_001dc04b:
    local_228._0_8_ = local_260._0_8_;
    uVar37 = local_270._M_unused._0_8_;
    sVar19 = local_48;
    if ((ValidationState_t *)local_270._M_unused._0_8_ == (ValidationState_t *)local_260)
    goto LAB_001db5a2;
LAB_001dc05a:
    operator_delete((void *)uVar37,
                    (ulong)((long)&((spv_const_context)local_228._0_8_)->target_env + 1));
    goto LAB_001db5a2;
  }
  switch(uVar3) {
  case 0x3b:
switchD_001d9ff1_caseD_3b:
    sVar19 = anon_unknown_2::ValidateVariable(_,inst);
    break;
  case 0x3c:
  case 0x45:
    goto switchD_001d9ff1_caseD_3c;
  case 0x3d:
    pIVar22 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if (pIVar22 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"OpLoad Result Type <id> ",0x18);
      uVar18 = (inst->inst_).type_id;
      goto LAB_001daf66;
    }
    uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar23 = ValidationState_t::FindDef(_,uVar15);
    if (pIVar23 == (Instruction *)0x0) {
LAB_001db6d5:
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"OpLoad Pointer <id> ",0x14);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
      pcVar33 = " is not a logical pointer.";
      lVar31 = 0x1a;
    }
    else {
      AVar14 = ValidationState_t::addressing_model(_);
      if (AVar14 == AddressingModelLogical) {
        bVar9 = (_->features_).variable_pointers;
        if ((bool)bVar9 == false) {
          iVar17 = spvOpcodeReturnsLogicalPointer((uint)(pIVar23->inst_).opcode);
          if (iVar17 == 0) goto LAB_001db6d5;
          bVar9 = (_->features_).variable_pointers;
        }
        if (((bVar9 & 1) != 0) &&
           (bVar10 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar23->inst_).opcode), !bVar10)
           ) goto LAB_001db6d5;
      }
      pIVar26 = ValidationState_t::FindDef(_,(pIVar23->inst_).type_id);
      if (pIVar26 != (Instruction *)0x0) {
        uVar5 = (pIVar26->inst_).opcode;
        if (uVar5 == 0x20) {
          uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar26,2);
          pIVar26 = ValidationState_t::FindDef(_,uVar13);
          if ((pIVar26 == (Instruction *)0x0) ||
             ((pIVar22->inst_).result_id != (pIVar26->inst_).result_id)) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,"OpLoad Result Type <id> ",0x18);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,(inst->inst_).type_id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218," does not match Pointer <id> ",0x1d);
            uVar18 = (pIVar23->inst_).result_id;
LAB_001dc00e:
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,uVar18);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,(char *)local_270._M_unused._0_8_,local_270._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"s type.",7);
            goto LAB_001dc04b;
          }
        }
        else if (uVar5 != 0x1141) goto LAB_001da5d7;
        if ((_->options_->before_hlsl_legalization == false) &&
           (bVar10 = ValidationState_t::ContainsRuntimeArray(_,(inst->inst_).type_id), bVar10)) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          pcVar33 = "Cannot load a runtime-sized array";
          lVar31 = 0x21;
        }
        else {
          sVar19 = anon_unknown_2::CheckMemoryAccess(_,inst,3);
          if (sVar19 != SPV_SUCCESS) {
            return sVar19;
          }
          bVar10 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
          if ((((!bVar10) ||
               (bVar10 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                   (_,(inst->inst_).type_id), !bVar10)) ||
              (uVar3 = (pIVar22->inst_).opcode, uVar3 - 0x15 < 4)) || (uVar3 == 0x20)) {
            ValidationState_t::RegisterQCOMImageProcessingTextureConsumer
                      (_,uVar15,inst,(Instruction *)0x0);
            goto switchD_001d9ff1_caseD_3c;
          }
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          pcVar33 = "8- or 16-bit loads must be a scalar, vector or matrix type";
          lVar31 = 0x3a;
        }
        goto LAB_001db494;
      }
LAB_001da5d7:
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"OpLoad type for pointer <id> ",0x1d);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
      pcVar33 = " is not a pointer type.";
      lVar31 = 0x17;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar33,lVar31);
    sVar19 = local_48;
    goto LAB_001db5a2;
  case 0x3e:
    uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar22 = ValidationState_t::FindDef(_,uVar15);
    if (pIVar22 == (Instruction *)0x0) {
LAB_001db2fb:
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"OpStore Pointer <id> ",0x15);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
      pcVar33 = " is not a logical pointer.";
LAB_001db350:
      lVar31 = 0x1a;
    }
    else {
      AVar14 = ValidationState_t::addressing_model(_);
      if (AVar14 == AddressingModelLogical) {
        bVar9 = (_->features_).variable_pointers;
        if ((bool)bVar9 == false) {
          iVar17 = spvOpcodeReturnsLogicalPointer((uint)(pIVar22->inst_).opcode);
          if (iVar17 == 0) goto LAB_001db2fb;
          bVar9 = (_->features_).variable_pointers;
        }
        if (((bVar9 & 1) != 0) &&
           (bVar10 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar22->inst_).opcode), !bVar10)
           ) goto LAB_001db2fb;
      }
      pIVar23 = ValidationState_t::FindDef(_,(pIVar22->inst_).type_id);
      if (pIVar23 == (Instruction *)0x0) {
LAB_001db1b3:
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"OpStore type for pointer <id> ",0x1e);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
        pcVar33 = " is not a pointer type.";
        lVar31 = 0x17;
      }
      else {
        uVar5 = (pIVar23->inst_).opcode;
        if (uVar5 == 0x20) {
          uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar23,2);
          pIVar26 = ValidationState_t::FindDef(_,uVar13);
          if ((pIVar26 != (Instruction *)0x0) && ((pIVar26->inst_).opcode != 0x13))
          goto LAB_001db895;
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"OpStore Pointer <id> ",0x15);
LAB_001db870:
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
          pcVar33 = "s type is void.";
          lVar31 = 0xf;
        }
        else {
          if (uVar5 != 0x1141) goto LAB_001db1b3;
          pIVar26 = (Instruction *)0x0;
LAB_001db895:
          bVar10 = ValidationState_t::GetPointerTypeInfo
                             (_,(pIVar23->inst_).result_id,(uint32_t *)local_238._M_pod_data,
                              (StorageClass *)&local_240);
          if (bVar10) {
            if ((9 < (uint)local_240) || ((0x203U >> ((uint)local_240 & 0x1f) & 1) == 0)) {
              if ((uint)local_240 == 0x14db) {
                ValidationState_t::VkErrorID_abi_cxx11_((string *)local_218,_,0x125f,(char *)0x0);
                local_248 = ValidationState_t::function(_,inst->function_->id_);
                local_298._0_8_ = local_298 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_298,CONCAT44(local_218._4_4_,local_218._0_4_),
                           local_210 + CONCAT44(local_218._4_4_,local_218._0_4_));
                local_270._8_8_ = (_Any_data *)0x0;
                local_270._M_unused._M_object = operator_new(0x20);
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &((ValidationState_t *)local_270._M_unused._0_8_)->context_)->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)&((ValidationState_t *)local_270._M_unused._0_8_)->words_;
                if ((undefined1 *)local_298._0_8_ == local_298 + 0x10) {
                  ((ValidationState_t *)local_270._M_unused._0_8_)->words_ =
                       (uint32_t *)local_298._16_8_;
                  (((vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *)
                   &((ValidationState_t *)local_270._M_unused._0_8_)->num_words_)->
                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>).
                  _M_impl.super__Vector_impl_data._M_start = (pointer)local_298._24_8_;
                }
                else {
                  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &((ValidationState_t *)local_270._M_unused._0_8_)->context_)->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start = (pointer)local_298._0_8_;
                  ((ValidationState_t *)local_270._M_unused._0_8_)->words_ =
                       (uint32_t *)local_298._16_8_;
                }
                ((ValidationState_t *)local_270._M_unused._0_8_)->options_ =
                     (spv_const_validator_options)local_298._8_8_;
                local_298._8_8_ = (spv_const_validator_options)0x0;
                local_298._16_8_ = local_298._16_8_ & 0xffffffffffffff00;
                local_260._8_8_ =
                     std::
                     _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_memory.cpp:1082:15)>
                     ::_M_invoke;
                local_260._0_8_ =
                     std::
                     _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_memory.cpp:1082:15)>
                     ::_M_manager;
                local_298._0_8_ = local_298 + 0x10;
                Function::RegisterExecutionModelLimitation
                          (local_248,
                           (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                            *)&local_270);
                if ((spv_const_context)local_260._0_8_ != (spv_const_context)0x0) {
                  (*(code *)local_260._0_8_)(&local_270,&local_270,3);
                }
                if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
                  operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_218._4_4_,local_218._0_4_) != local_208) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT44(local_218._4_4_,local_218._0_4_),
                                  local_208[0]._M_allocated_capacity + 1);
                }
              }
              else if ((uint)local_240 == 0x14df) {
                ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
                pcVar33 = "ShaderRecordBufferKHR Storage Class variables are read only";
                goto LAB_001dc297;
              }
              bVar10 = spvIsVulkanEnv(_->context_->target_env);
              if (((bVar10) && ((uint)local_240 == 2)) &&
                 (pIVar22 = ValidationState_t::TracePointer(_,pIVar22),
                 (pIVar22->inst_).opcode == 0x3b)) {
                uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,0);
                pIVar22 = ValidationState_t::FindDef(_,uVar13);
                uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,2);
                pIVar22 = ValidationState_t::FindDef(_,uVar13);
                if (((pIVar22->inst_).opcode & 0xfffe) == 0x1c) {
                  uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,1);
                  pIVar22 = ValidationState_t::FindDef(_,uVar13);
                }
                bVar10 = ValidationState_t::HasDecoration(_,(pIVar22->inst_).result_id,Block);
                if (bVar10) {
                  ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  ValidationState_t::VkErrorID_abi_cxx11_((string *)local_298,_,0x1b0d,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
                  pcVar33 = "In the Vulkan environment, cannot store to Uniform Blocks";
                  lVar31 = 0x39;
                  goto LAB_001db58b;
                }
              }
              uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,1);
              pIVar22 = ValidationState_t::FindDef(_,uVar13);
              if ((pIVar22 == (Instruction *)0x0) ||
                 (uVar18 = (pIVar22->inst_).type_id, uVar18 == 0)) {
                ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"OpStore Object <id> ",0x14);
                ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar13);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
                pcVar33 = " is not an object.";
                goto LAB_001db586;
              }
              pIVar23 = ValidationState_t::FindDef(_,uVar18);
              if ((pIVar23 == (Instruction *)0x0) ||
                 (uVar5 = (pIVar23->inst_).opcode, uVar5 == 0x13)) {
                ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"OpStore Object <id> ",0x14);
                uVar15 = uVar13;
                goto LAB_001db870;
              }
              if ((pIVar26 != (Instruction *)0x0) &&
                 ((pIVar26->inst_).result_id != (pIVar23->inst_).result_id)) {
                if ((_->options_->relax_struct_store == true) &&
                   ((uVar5 == 0x1e && ((pIVar26->inst_).opcode == 0x1e)))) {
                  bVar10 = anon_unknown_2::AreLayoutCompatibleStructs(_,pIVar26,pIVar23);
                  if (bVar10) goto LAB_001dcc06;
                  ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,"OpStore Pointer <id> ",0x15);
                  ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,"s layout does not match Object <id> ",0x24);
                  ValidationState_t::getIdName_abi_cxx11_
                            ((string *)&local_238,_,(pIVar22->inst_).result_id);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,(char *)local_238._M_unused._0_8_,local_238._8_8_)
                  ;
                  pcVar33 = "s layout.";
                  lVar31 = 9;
                }
                else {
                  ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,"OpStore Pointer <id> ",0x15);
                  ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,"s type does not match Object <id> ",0x22);
                  ValidationState_t::getIdName_abi_cxx11_
                            ((string *)&local_238,_,(pIVar22->inst_).result_id);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,(char *)local_238._M_unused._0_8_,local_238._8_8_)
                  ;
                  pcVar33 = "s type.";
                  lVar31 = 7;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,pcVar33,lVar31);
                uVar37 = local_238._M_unused._0_8_;
                sVar19 = local_48;
                if ((ValidationState_t *)local_238._M_unused._0_8_ != (ValidationState_t *)local_228
                   ) goto LAB_001dc05a;
                goto LAB_001db5a2;
              }
LAB_001dcc06:
              sVar19 = anon_unknown_2::CheckMemoryAccess(_,inst,2);
              if (sVar19 != SPV_SUCCESS) {
                return sVar19;
              }
              bVar10 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader)
              ;
              if ((((bVar10) &&
                   (bVar10 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                       (_,(inst->inst_).type_id), bVar10)) &&
                  (uVar3 = (pIVar23->inst_).opcode, 3 < uVar3 - 0x15)) && (uVar3 != 0x20)) {
                ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
                pcVar33 = "8- or 16-bit stores must be a scalar, vector or matrix type";
                goto LAB_001dc297;
              }
              goto switchD_001d9ff1_caseD_3c;
            }
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,"OpStore Pointer <id> ",0x15);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
            pcVar33 = " storage class is read-only";
LAB_001dbe8f:
            lVar31 = 0x1b;
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,"OpStore Pointer <id> ",0x15);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
            pcVar33 = " is not pointer type";
            lVar31 = 0x14;
          }
        }
      }
    }
    goto LAB_001db58b;
  case 0x3f:
  case 0x40:
    uVar18 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar22 = ValidationState_t::FindDef(_,uVar18);
    if (pIVar22 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Target operand <id> ",0x14);
    }
    else {
      uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      pIVar23 = ValidationState_t::FindDef(_,uVar15);
      if (pIVar23 != (Instruction *)0x0) {
        pFVar20 = (Function *)ValidationState_t::FindDef(_,(pIVar22->inst_).type_id);
        if ((pFVar20 == (Function *)0x0) ||
           ((sVar4 = *(short *)((long)&(pFVar20->blocks_)._M_h._M_rehash_policy._M_max_load_factor +
                               2), sVar4 != 0x20 && (sVar4 != 0x1141)))) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"Target operand <id> ",0x14);
LAB_001db56b:
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
          pcVar33 = " is not a pointer.";
LAB_001db586:
          lVar31 = 0x12;
          goto LAB_001db58b;
        }
        local_248 = pFVar20;
        pIVar22 = ValidationState_t::FindDef(_,(pIVar23->inst_).type_id);
        if ((pIVar22 == (Instruction *)0x0) ||
           ((uVar5 = (pIVar22->inst_).opcode, uVar5 != 0x20 && (uVar5 != 0x1141)))) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"Source operand <id> ",0x14);
          uVar18 = uVar15;
          goto LAB_001db56b;
        }
        if ((inst->inst_).opcode != 0x3f) {
          uVar18 = Instruction::GetOperandAs<unsigned_int>(inst,2);
          pIVar23 = ValidationState_t::FindDef(_,uVar18);
          if (pIVar23 == (Instruction *)0x0) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            pcVar33 = "Size operand <id> ";
            lVar31 = 0x12;
            goto LAB_001daed5;
          }
          local_260._20_4_ = uVar18;
          pIVar26 = ValidationState_t::FindDef(_,(pIVar23->inst_).type_id);
          bVar10 = ValidationState_t::IsIntScalarType(_,(pIVar26->inst_).result_id);
          id = local_260._20_4_;
          if (!bVar10) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,"Size operand <id> ",0x12);
            uVar15 = local_260._20_4_;
LAB_001dc496:
            ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
            pcVar33 = " must be a scalar integer type.";
            lVar31 = 0x1f;
            goto LAB_001db58b;
          }
          uVar5 = (pIVar23->inst_).opcode;
          if (uVar5 == 0x2b) {
            puVar7 = (pIVar23->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar31 = (long)(pIVar23->words_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar7;
            if (((pIVar26->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[3] == 1) &&
               (*(int *)((long)puVar7 + lVar31 + -4) < 0)) {
              ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218,"Size operand <id> ",0x12);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,local_260._20_4_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
              pcVar33 = " cannot have the sign bit set to 1.";
              lVar31 = 0x23;
              goto LAB_001db58b;
            }
            uVar29 = lVar31 >> 2;
            uVar36 = 3;
            if (uVar29 < 4) {
              uVar29 = 3;
            }
            do {
              if (uVar29 == uVar36) goto LAB_001dbe3a;
              puVar2 = puVar7 + uVar36;
              uVar36 = uVar36 + 1;
            } while (*puVar2 == 0);
LAB_001dc761:
            pCVar1 = &_->module_capabilities_;
            bVar10 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityShader);
            if (bVar10) {
              ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_218,_,id)
              ;
              local_260._20_4_ = local_218._0_4_;
              if (((local_218._0_4_ & 3) != 0 & local_218[4]) == 1) {
                SVar16 = Instruction::GetOperandAs<spv::StorageClass>(pIVar22,1);
                local_40 = CONCAT44(extraout_var,SVar16);
                SVar16 = Instruction::GetOperandAs<spv::StorageClass>((Instruction *)local_248,1);
                local_38._M_nxt = (_Hash_node_base *)CONCAT44(extraout_var_00,SVar16);
                local_260[0x13] = EnumSet<spv::Capability>::contains(pCVar1,CapabilityInt8);
                bVar10 = EnumSet<spv::Capability>::contains
                                   (pCVar1,CapabilityUniformAndStorageBuffer8BitAccess);
                bVar8 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageBuffer8BitAccess)
                ;
                local_260[0x11] =
                     EnumSet<spv::Capability>::contains(pCVar1,CapabilityStoragePushConstant8);
                local_274 = EnumSet<spv::Capability>::contains
                                      (pCVar1,CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR);
                local_260[0x12] = EnumSet<spv::Capability>::contains(pCVar1,CapabilityInt16);
                bVar11 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStorageUniform16);
                local_275 = bVar10 || bVar11;
                local_273 = bVar10;
                bVar12 = EnumSet<spv::Capability>::contains
                                   (pCVar1,CapabilityStorageBuffer16BitAccess);
                bVar11 = (bVar12 || bVar11) || (bVar8 || bVar10);
                local_276 = bVar8 || bVar10;
                bVar10 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityStoragePushConstant16);
                bVar9 = local_260[0x11];
                bVar38 = bVar10 | local_260[0x11];
                local_272 = EnumSet<spv::Capability>::contains
                                      (pCVar1,CapabilityStorageInputOutput16);
                bVar10 = EnumSet<spv::Capability>::contains
                                   (pCVar1,CapabilityWorkgroupMemoryExplicitLayout16BitAccessKHR);
                bVar27 = 0;
                bVar30 = 0;
                switch((int)local_40) {
                case 1:
                case 3:
                  bVar27 = local_272;
                  bVar30 = 0;
                  break;
                case 2:
                  bVar27 = local_275;
                  bVar30 = local_273;
                  break;
                case 4:
                  bVar27 = bVar10;
                  bVar30 = local_274;
                  break;
                case 5:
                case 6:
                case 7:
                case 8:
                case 10:
                case 0xb:
                  break;
                case 9:
                  bVar27 = bVar38;
                  bVar30 = bVar9;
                  break;
                case 0xc:
                  bVar27 = bVar11;
                  bVar30 = local_276;
                  break;
                default:
                  bVar30 = 0;
                }
                bVar32 = 0;
                bVar35 = 0;
                switch((int)local_38._M_nxt) {
                case 2:
                  bVar32 = local_275;
                  bVar35 = local_273;
                  break;
                case 3:
                  bVar32 = local_272;
                  bVar35 = 0;
                  break;
                case 4:
                  bVar32 = bVar10;
                  bVar35 = local_274;
                  break;
                case 5:
                case 6:
                case 7:
                case 8:
                case 10:
                case 0xb:
                  break;
                case 9:
                  bVar32 = bVar38;
                  bVar35 = bVar9;
                  break;
                case 0xc:
                  bVar32 = bVar11;
                  bVar35 = local_276;
                  break;
                default:
                  bVar32 = 0;
                  bVar35 = 0;
                }
                if ((local_260[0x12] == '\0' && (bVar27 & bVar32) == 0) && local_260[0x13] == '\0')
                {
                  ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  pcVar33 = "Size must be a multiple of 4";
                }
                else {
                  if ((local_260[0x13] != '\0' || (bVar30 & bVar35) != 0) ||
                      (local_260._20_4_ & 1) == 0) goto LAB_001dd06d;
                  ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  pcVar33 = "Size must be a multiple of 2";
                }
                lVar31 = 0x1c;
                goto LAB_001db494;
              }
            }
LAB_001dd06d:
            uVar18 = 3;
            goto LAB_001dd078;
          }
          if (uVar5 != 0x2e) goto LAB_001dc761;
LAB_001dbe3a:
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"Size operand <id> ",0x12);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
          pcVar33 = " cannot be a constant zero.";
          goto LAB_001dbe8f;
        }
        if (*(short *)((long)&(local_248->blocks_)._M_h._M_rehash_policy._M_max_load_factor + 2) !=
            0x20) {
          if (uVar5 != 0x20) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            pcVar33 = "One of Source or Target must be a typed pointer";
            goto LAB_001dad6d;
          }
          pIVar23 = (Instruction *)0x0;
LAB_001dc661:
          uVar13 = Instruction::GetOperandAs<unsigned_int>(pIVar22,2);
          pIVar22 = ValidationState_t::FindDef(_,uVar13);
          if ((pIVar22 == (Instruction *)0x0) || ((pIVar22->inst_).opcode == 0x13)) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,"Source operand <id> ",0x14);
            goto LAB_001dc6c8;
          }
          if ((pIVar23 == (Instruction *)0x0) ||
             ((pIVar23->inst_).result_id == (pIVar22->inst_).result_id)) goto LAB_001dc8f0;
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"Target <id> ",0xc);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"s type does not match Source <id> ",0x22);
          uVar18 = (pIVar22->inst_).result_id;
          goto LAB_001dc00e;
        }
        uVar13 = Instruction::GetOperandAs<unsigned_int>((Instruction *)local_248,2);
        pIVar23 = ValidationState_t::FindDef(_,uVar13);
        if ((pIVar23 == (Instruction *)0x0) || ((pIVar23->inst_).opcode == 0x13)) {
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"Target operand <id> ",0x14);
          uVar15 = uVar18;
LAB_001dc6c8:
          ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
          pcVar33 = " cannot be a void pointer.";
          goto LAB_001db350;
        }
        if (uVar5 == 0x20) goto LAB_001dc661;
LAB_001dc8f0:
        uVar18 = 2;
LAB_001dd078:
        sVar19 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar18);
        if (sVar19 != SPV_SUCCESS) {
          return sVar19;
        }
        uVar3 = (inst->inst_).opcode;
        if (1 < uVar3 - 0x3f) {
          __assert_fail("inst->opcode() == spv::Op::OpCopyMemory || inst->opcode() == spv::Op::OpCopyMemorySized"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_memory.cpp"
                        ,0x494,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidateCopyMemoryMemoryAccess(ValidationState_t &, const Instruction *)"
                       );
        }
        uVar15 = uVar3 == 0x3f ^ 3;
        if ((ulong)uVar15 <
            (ulong)((long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4)) {
          sVar19 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar15);
          if (sVar19 != SPV_SUCCESS) {
            return sVar19;
          }
          uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar15);
          uVar15 = (((uVar13 >> 3 & 1) + uVar15 + (uint)((uVar13 >> 4 & 1) != 0)) -
                   (uint)((uVar13 & 2) == 0)) + 2;
          if ((ulong)uVar15 <
              (ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
            if ((_->features_).copy_memory_permits_two_memory_accesses == true) {
              sVar19 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar15);
              if (sVar19 != SPV_SUCCESS) {
                return sVar19;
              }
              if ((uVar13 & 0x10) == 0) {
                uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar15);
                if ((uVar15 & 8) == 0) goto LAB_001dd285;
                ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar33 = "Source memory access must not include MakePointerAvailableKHR";
                lVar31 = 0x3d;
              }
              else {
                ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar33 = "Target memory access must not include MakePointerVisibleKHR";
                lVar31 = 0x3b;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218,pcVar33,lVar31);
              sVar19 = local_48;
            }
            else {
              ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
              local_298._0_8_ = spvOpcodeString((uint)(inst->inst_).opcode);
              pDVar25 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)local_218,(char **)local_298);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar25,
                         " with two memory access operands requires SPIR-V 1.4 or later",0x3d);
              sVar19 = pDVar25->error_;
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
            if (sVar19 != SPV_SUCCESS) {
              return sVar19;
            }
          }
        }
LAB_001dd285:
        pFVar20 = local_248;
        if (*(short *)((long)&(local_248->blocks_)._M_h._M_rehash_policy._M_max_load_factor + 2) !=
            0x20) goto switchD_001d9ff1_caseD_3c;
        do {
          uVar15 = Instruction::GetOperandAs<unsigned_int>((Instruction *)pFVar20,2);
          pFVar20 = (Function *)ValidationState_t::FindDef(_,uVar15);
        } while (*(short *)((long)&(pFVar20->blocks_)._M_h._M_rehash_policy._M_max_load_factor + 2)
                 == 0x20);
        bVar10 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if ((!bVar10) ||
           (bVar10 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                               (_,*(uint32_t *)
                                   ((long)&(pFVar20->blocks_)._M_h._M_rehash_policy._M_next_resize +
                                   4)), !bVar10)) goto switchD_001d9ff1_caseD_3c;
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        pcVar33 = "Cannot copy memory of objects containing 8- or 16-bit types";
LAB_001dc297:
        lVar31 = 0x3b;
        goto LAB_001db494;
      }
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      pcVar33 = "Source operand <id> ";
      lVar31 = 0x14;
      uVar18 = uVar15;
LAB_001daed5:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar33,lVar31);
    }
LAB_001daf66:
    ValidationState_t::getIdName_abi_cxx11_((string *)local_298,_,uVar18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
    pcVar33 = " is not defined.";
    lVar31 = 0x10;
LAB_001db58b:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar33,lVar31);
    sVar19 = local_48;
LAB_001db5a2:
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
LAB_001db5bc:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
    break;
  case 0x41:
  case 0x42:
  case 0x46:
switchD_001d9ff1_caseD_41:
    sVar19 = anon_unknown_2::ValidateAccessChain(_,inst);
    break;
  case 0x43:
switchD_001d9ff1_caseD_43:
    AVar14 = ValidationState_t::addressing_model(_);
    if (((AVar14 == AddressingModelLogical) && ((inst->inst_).opcode == 0x43)) &&
       ((_->features_).variable_pointers == false)) {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Generating variable pointers requires capability ",0x31);
      pcVar33 = "VariablePointers or VariablePointersStorageBuffer";
      lVar31 = 0x31;
    }
    else {
      sVar19 = anon_unknown_2::ValidateAccessChain(_,inst);
      if (sVar19 != SPV_SUCCESS) {
        return sVar19;
      }
      bVar10 = spvOpcodeGeneratesUntypedPointer((uint)(inst->inst_).opcode);
      uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar22 = ValidationState_t::FindDef(_,uVar15);
      if (bVar10) {
        uVar18 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      }
      else {
        uVar18 = (pIVar22->inst_).type_id;
      }
      pIVar22 = ValidationState_t::FindDef(_,uVar18);
      SVar16 = Instruction::GetOperandAs<spv::StorageClass>(pIVar22,1);
      pCVar1 = &_->module_capabilities_;
      bVar8 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityShader);
      if ((!bVar8) ||
         ((((StorageBuffer < SVar16 || ((0x1204U >> (SVar16 & 0x1f) & 1) == 0)) &&
           ((SVar16 != PhysicalStorageBuffer &&
            ((bVar8 = EnumSet<spv::Capability>::contains
                                (pCVar1,CapabilityWorkgroupMemoryExplicitLayoutKHR),
             SVar16 != StorageClassWorkgroup || (!bVar8)))))) ||
          (bVar8 = ValidationState_t::HasDecoration(_,(pIVar22->inst_).result_id,ArrayStride), bVar8
          )))) {
        bVar8 = spvIsVulkanEnv(_->context_->target_env);
        if (bVar8) {
          if (bVar10) {
            bVar10 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityUntypedPointersKHR);
          }
          else {
            bVar10 = false;
          }
          if (SVar16 != PhysicalStorageBuffer) {
            if (SVar16 == StorageBuffer) {
              if (bVar10 == false && (_->features_).variable_pointers == false) {
                ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                ValidationState_t::VkErrorID_abi_cxx11_((string *)local_298,_,0x1de4,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
                pcVar33 = 
                "OpPtrAccessChain Base operand pointing to StorageBuffer storage class must use VariablePointers or VariablePointersStorageBuffer capability"
                ;
                lVar31 = 0x8b;
                goto LAB_001db58b;
              }
            }
            else if (SVar16 == StorageClassWorkgroup) {
              bVar8 = EnumSet<spv::Capability>::contains(pCVar1,CapabilityVariablePointers);
              if (bVar10 == false && !bVar8) {
                ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                ValidationState_t::VkErrorID_abi_cxx11_((string *)local_298,_,0x1de3,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
                pcVar33 = 
                "OpPtrAccessChain Base operand pointing to Workgroup storage class must use VariablePointers capability"
                ;
                lVar31 = 0x66;
                goto LAB_001db58b;
              }
            }
            else if (bVar10 == false) {
              ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
              ValidationState_t::VkErrorID_abi_cxx11_((string *)local_298,_,0x1de2,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
              pcVar33 = 
              "OpPtrAccessChain Base operand must point to Workgroup, StorageBuffer, or PhysicalStorageBuffer storage class"
              ;
              lVar31 = 0x6c;
              goto LAB_001db58b;
            }
          }
        }
        goto switchD_001d9ff1_caseD_3c;
      }
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar33 = "OpPtrAccessChain must have a Base whose type is decorated with ArrayStride";
      lVar31 = 0x4a;
    }
LAB_001db494:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar33,lVar31);
    sVar19 = local_48;
    goto LAB_001db5bc;
  case 0x44:
switchD_001d9ff1_caseD_44:
    pcVar33 = spvOpcodeString((uint)uVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_218,pcVar33,(allocator<char> *)local_270._M_pod_data);
    plVar21 = (long *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x3c1057);
    local_298._0_8_ = local_298 + 0x10;
    psVar28 = (size_type *)(plVar21 + 2);
    if ((size_type *)*plVar21 == psVar28) {
      local_298._16_8_ = *psVar28;
      local_298._24_8_ = plVar21[3];
    }
    else {
      local_298._16_8_ = *psVar28;
      local_298._0_8_ = (size_type *)*plVar21;
    }
    local_298._8_8_ = plVar21[1];
    *plVar21 = (long)psVar28;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_218._4_4_,local_218._0_4_) != local_208) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_218._4_4_,local_218._0_4_),
                      local_208[0]._M_allocated_capacity + 1);
    }
    pIVar22 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((((pIVar22->inst_).opcode != 0x15) ||
        (uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar22,1), uVar15 != 0x20)) ||
       (uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar22,2), uVar15 != 0)) {
LAB_001dac73:
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"The Result Type of ",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_270._M_unused._0_8_,local_270._8_8_);
      pcVar33 = " must be OpTypeInt with width 32 and signedness 0.";
      lVar31 = 0x32;
      goto LAB_001dacf6;
    }
    uVar5 = (inst->inst_).opcode;
    uVar18 = ValidationState_t::GetOperandTypeId(_,inst,(ulong)(uVar5 == 0x1149) | 2);
    pIVar22 = ValidationState_t::FindDef(_,uVar18);
    uVar6 = (pIVar22->inst_).opcode;
    if (uVar5 != 0x1149) {
      if (uVar6 == 0x20) goto LAB_001dba6e;
LAB_001dbb70:
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"The Structure\'s type in ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,(char *)local_270._M_unused._0_8_,local_270._8_8_);
      pcVar33 = " must be a pointer to an OpTypeStruct.";
      lVar31 = 0x26;
      goto LAB_001dacf6;
    }
    pIVar22 = inst;
    if (uVar6 == 0x1141) {
LAB_001dba6e:
      uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar22,2);
      pIVar22 = ValidationState_t::FindDef(_,uVar15);
      if ((pIVar22->inst_).opcode != 0x1e) goto LAB_001dbb70;
      lVar31 = (long)(pIVar22->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pIVar22->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar22,lVar31 - 1);
      pIVar22 = ValidationState_t::FindDef(_,uVar15);
      if ((pIVar22->inst_).opcode != 0x1d) {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"The Structure\'s last member in ",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_270._M_unused._0_8_,local_270._8_8_);
        pcVar33 = " must be an OpTypeRuntimeArray.";
        lVar31 = 0x1f;
LAB_001dacf6:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,pcVar33,lVar31);
        sVar19 = local_48;
        if ((ValidationState_t *)local_270._M_unused._0_8_ != (ValidationState_t *)local_260) {
          operator_delete(local_270._M_unused._M_object,
                          (ulong)((long)(spv_target_env *)local_260._0_8_ + 1));
        }
        goto LAB_001dad27;
      }
      uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)(uVar5 == 0x1149) + 3);
      sVar19 = SPV_SUCCESS;
      if (lVar31 - 2U != (ulong)uVar15) {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"The array member in ",0x14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_298._0_8_,local_298._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_270,_,(inst->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,(char *)local_270._M_unused._0_8_,local_270._8_8_);
        pcVar33 = " must be the last member of the struct.";
        lVar31 = 0x27;
        goto LAB_001dacf6;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,"Pointer must be an untyped pointer",0x22);
      sVar19 = local_48;
LAB_001dad27:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_218);
    }
LAB_001dad2c:
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
LAB_001dad39:
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    break;
  default:
    if (uVar3 - OpPtrEqual < 3) {
      AVar14 = ValidationState_t::addressing_model(_);
      if ((AVar14 == AddressingModelLogical) && ((_->features_).variable_pointers == false)) {
        ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
        pcVar33 = 
        "Instruction cannot for logical addressing model be used without a variable pointers capability"
        ;
        lVar31 = 0x5e;
      }
      else {
        pIVar22 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
        if ((inst->inst_).opcode == 0x193) {
          if ((pIVar22 == (Instruction *)0x0) || ((pIVar22->inst_).opcode != 0x15)) {
            ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
            pcVar33 = "Result Type must be an integer scalar";
            lVar31 = 0x25;
          }
          else {
LAB_001da3b5:
            uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,2);
            pIVar22 = ValidationState_t::FindDef(_,uVar15);
            uVar15 = Instruction::GetOperandAs<unsigned_int>(inst,3);
            pIVar23 = ValidationState_t::FindDef(_,uVar15);
            if ((pIVar23 == (Instruction *)0x0 || pIVar22 == (Instruction *)0x0) ||
               (uVar18 = (pIVar22->inst_).type_id, uVar18 != (pIVar23->inst_).type_id)) {
              ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
              pcVar33 = "The types of Operand 1 and Operand 2 must match";
LAB_001dad6d:
              lVar31 = 0x2f;
            }
            else {
              pIVar22 = ValidationState_t::FindDef(_,uVar18);
              if ((pIVar22 == (Instruction *)0x0) ||
                 ((uVar5 = (pIVar22->inst_).opcode, uVar5 != 0x20 && (uVar5 != 0x1141)))) {
                ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
                pcVar33 = "Operand type must be a pointer";
                goto LAB_001daa9c;
              }
              SVar16 = Instruction::GetOperandAs<spv::StorageClass>(pIVar22,1);
              AVar14 = ValidationState_t::addressing_model(_);
              if (AVar14 == AddressingModelLogical) {
                if ((SVar16 & ~Generic) == StorageClassWorkgroup) {
                  if ((SVar16 != StorageClassWorkgroup) ||
                     (bVar10 = EnumSet<spv::Capability>::contains
                                         (&_->module_capabilities_,CapabilityVariablePointers),
                     bVar10)) goto switchD_001d9ff1_caseD_3c;
                  ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  pcVar33 = 
                  "Workgroup storage class pointer requires VariablePointers capability to be specified"
                  ;
                  lVar31 = 0x54;
                }
                else {
                  ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  pcVar33 = "Invalid pointer storage class";
                  lVar31 = 0x1d;
                }
              }
              else {
                if (SVar16 != PhysicalStorageBuffer) goto switchD_001d9ff1_caseD_3c;
                ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
                pcVar33 = "Cannot use a pointer in the PhysicalStorageBuffer storage class";
                lVar31 = 0x3f;
              }
            }
          }
        }
        else {
          if ((pIVar22 != (Instruction *)0x0) && ((pIVar22->inst_).opcode == 0x14))
          goto LAB_001da3b5;
          ValidationState_t::diag((DiagnosticStream *)local_218,_,SPV_ERROR_INVALID_ID,inst);
          pcVar33 = "Result Type must be OpTypeBool";
LAB_001daa9c:
          lVar31 = 0x1e;
        }
      }
      goto LAB_001db494;
    }
    goto switchD_001d9ff1_caseD_3c;
  }
joined_r0x001db5c3:
  if (sVar19 == SPV_SUCCESS) {
switchD_001d9ff1_caseD_3c:
    sVar19 = SPV_SUCCESS;
  }
  return sVar19;
}

Assistant:

spv_result_t MemoryPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
      if (auto error = ValidateVariable(_, inst)) return error;
      break;
    case spv::Op::OpLoad:
      if (auto error = ValidateLoad(_, inst)) return error;
      break;
    case spv::Op::OpStore:
      if (auto error = ValidateStore(_, inst)) return error;
      break;
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
      if (auto error = ValidateCopyMemory(_, inst)) return error;
      break;
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpUntypedPtrAccessChainKHR:
    case spv::Op::OpUntypedInBoundsPtrAccessChainKHR:
      if (auto error = ValidatePtrAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
      if (auto error = ValidateAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpRawAccessChainNV:
      if (auto error = ValidateRawAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpArrayLength:
    case spv::Op::OpUntypedArrayLengthKHR:
      if (auto error = ValidateArrayLength(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadNV:
    case spv::Op::OpCooperativeMatrixStoreNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLengthKHR:
    case spv::Op::OpCooperativeMatrixLengthNV:
      if (auto error = ValidateCooperativeMatrixLengthNV(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadKHR:
    case spv::Op::OpCooperativeMatrixStoreKHR:
      if (auto error = ValidateCooperativeMatrixLoadStoreKHR(_, inst))
        return error;
      break;
    case spv::Op::OpPtrEqual:
    case spv::Op::OpPtrNotEqual:
    case spv::Op::OpPtrDiff:
      if (auto error = ValidatePtrComparison(_, inst)) return error;
      break;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpGenericPtrMemSemantics:
    default:
      break;
  }

  return SPV_SUCCESS;
}